

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall
CVmFormatter::write_text
          (CVmFormatter *this,wchar_t *txt,size_t cnt,vmcon_color_t *colors,vm_nl_type nl)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  vmcon_color_t *in_RCX;
  long in_RDX;
  uint *in_RSI;
  char *pcVar4;
  long *in_RDI;
  int in_R8D;
  bool bVar5;
  wchar_t c;
  size_t old_rem;
  size_t cur;
  size_t rem;
  char *dst;
  char local_buf [128];
  CCharmapToLocal *local_e8;
  uint local_cc;
  ulong local_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [132];
  int local_24;
  vmcon_color_t *local_20;
  long local_18;
  uint *local_10;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar2 = CVmConsole::is_quiet_script((CVmConsole *)in_RDI[1]);
  if ((iVar2 == 0) || ((*(byte *)(in_RDI + 0x1e07) & 1) == 0)) {
    iVar2 = (**(code **)(*in_RDI + 0x68))();
    if ((iVar2 != 0) &&
       (((iVar2 = (**(code **)(*(long *)in_RDI[1] + 0x28))(), iVar2 != 0 && ((int)in_RDI[4] == 0))
        && (iVar2 = *(int *)((long)in_RDI + 0x24),
           iVar3 = (**(code **)(*(long *)in_RDI[1] + 0x40))(), iVar3 <= iVar2 + 1)))) {
      (**(code **)(*in_RDI + 0x28))(in_RDI,0x2000000,0x3000000);
      (**(code **)(*in_RDI + 0x38))(in_RDI,0);
      (**(code **)(*(long *)in_RDI[1] + 0x48))();
      (**(code **)(*in_RDI + 0x28))(in_RDI,in_RDI[0x1da1],in_RDI[0x1da2]);
      (**(code **)(*in_RDI + 0x38))(in_RDI,(int)in_RDI[0x1da3]);
    }
    if ((local_24 != 0) && (local_24 != 4)) {
      *(int *)((long)in_RDI + 0x24) = *(int *)((long)in_RDI + 0x24) + 1;
    }
    local_b0 = local_a8;
    local_b8 = 0x7f;
    while (local_18 != 0) {
      if ((local_20 != (vmcon_color_t *)0x0) &&
         (iVar2 = vmcon_color_t::equals(local_20,(vmcon_color_t *)(in_RDI + 0x1da1)), iVar2 == 0)) {
        *local_b0 = 0;
        (**(code **)(*in_RDI + 0x40))(in_RDI,local_a8);
        local_b0 = local_a8;
        local_b8 = 0x7f;
        if (local_20->attr != (int)in_RDI[0x1da3]) {
          (**(code **)(*in_RDI + 0x38))(in_RDI,local_20->attr);
        }
        if ((local_20->fg != in_RDI[0x1da1]) || (local_20->bg != in_RDI[0x1da2])) {
          (**(code **)(*in_RDI + 0x28))(in_RDI,local_20->fg,local_20->bg);
        }
        in_RDI[0x1da1] = local_20->fg;
        in_RDI[0x1da2] = local_20->bg;
        in_RDI[0x1da3] = *(long *)&local_20->attr;
      }
      uVar1 = local_b8;
      local_cc = *local_10;
      if (((*(ushort *)((long)in_RDI + 0xef81) >> 6 & 1) == 0) && (local_cc == 0xa0)) {
        local_cc = 0x20;
      }
      if (in_RDI[2] == 0) {
        local_e8 = G_cmap_to_ui_X;
      }
      else {
        local_e8 = (CCharmapToLocal *)in_RDI[2];
      }
      iVar2 = (*(local_e8->super_CCharmap)._vptr_CCharmap[2])
                        (local_e8,(ulong)local_cc,&local_b0,&local_b8);
      if (uVar1 < CONCAT44(extraout_var,iVar2)) {
        *local_b0 = 0;
        (**(code **)(*in_RDI + 0x40))(in_RDI,local_a8);
        local_b0 = local_a8;
        local_b8 = 0x7f;
      }
      else {
        local_10 = local_10 + 1;
        local_18 = local_18 + -1;
        if (local_20 != (vmcon_color_t *)0x0) {
          local_20 = local_20 + 1;
        }
      }
    }
    if (local_a8 < local_b0) {
      *local_b0 = 0;
      (**(code **)(*in_RDI + 0x40))(in_RDI,local_a8);
    }
    switch(local_24) {
    case 0:
    case 1:
    case 4:
      break;
    case 2:
      bVar5 = false;
      if ((*(ushort *)((long)in_RDI + 0xef81) >> 6 & 1) != 0) {
        bVar5 = *(int *)((long)in_RDI + 0xefe4) == 0;
      }
      pcVar4 = "\n";
      if (bVar5) {
        pcVar4 = "<BR HEIGHT=0>\n";
      }
      (**(code **)(*in_RDI + 0x40))(in_RDI,pcVar4);
      break;
    case 3:
      (**(code **)(*in_RDI + 0x40))(in_RDI," ");
    }
  }
  return;
}

Assistant:

void CVmFormatter::write_text(VMG_ const wchar_t *txt, size_t cnt,
                              const vmcon_color_t *colors, vm_nl_type nl)
{
    /* 
     *   Check the "script quiet" mode - this indicates that we're reading
     *   a script and not echoing output to the display.  If this mode is
     *   on, and we're writing to the display, suppress this write.  If
     *   the mode is off, or we're writing to a non-display stream (such
     *   as a log file stream), show the output as normal.  
     */
    if (!console_->is_quiet_script() || !is_disp_stream_)
    {
        char local_buf[128];
        char *dst;
        size_t rem;

        /*
         *   Check to see if we've reached the end of the screen, and if so
         *   run the MORE prompt.  Note that we don't show a MORE prompt
         *   unless we're in "formatter more mode," since if we're not, then
         *   the OS layer code is taking responsibility for pagination
         *   issues.
         *   
         *   Note that we suppress the MORE prompt if we're showing a
         *   continuation of a line already partially shown.  We only want to
         *   show a MORE prompt at the start of a new line.
         *   
         *   Skip the MORE prompt if this stream doesn't use it.  
         */
        if (formatter_more_mode()
            && console_->is_more_mode()
            && !is_continuation_
            && linecnt_ + 1 >= console_->get_page_length())
        {
            /* set the standard text color */
            set_os_text_color(OS_COLOR_P_TEXT, OS_COLOR_P_TEXTBG);
            set_os_text_attr(0);

            /* display the MORE prompt */
            console_->show_more_prompt(vmg0_);

            /* restore the current color scheme */
            set_os_text_color(os_color_.fg, os_color_.bg);
            set_os_text_attr(os_color_.attr);
        }

        /* count the line if a newline follows */
        if (nl != VM_NL_NONE && nl != VM_NL_NONE_INTERNAL)
            ++linecnt_;

        /* convert and display the text */
        for (dst = local_buf, rem = sizeof(local_buf) - 1 ; cnt != 0 ; )
        {
            size_t cur;
            size_t old_rem;
            wchar_t c;
            
            /* 
             *   if this character is in a new color, write out the OS-level
             *   color switch code 
             */
            if (colors != 0 && !colors->equals(&os_color_))
            {
                /* 
                 *   null-terminate and display what's in the buffer so far,
                 *   so that we close out all of the remaining text in the
                 *   old color and attributes
                 */
                *dst = '\0';
                print_to_os(local_buf);

                /* reset to the start of the local output buffer */
                dst = local_buf;
                rem = sizeof(local_buf) - 1;

                /* set the text attributes, if they changed */
                if (colors->attr != os_color_.attr)
                    set_os_text_attr(colors->attr);

                /* set the color, if it changed */
                if (colors->fg != os_color_.fg
                    || colors->bg != os_color_.bg)
                    set_os_text_color(colors->fg, colors->bg);

                /* 
                 *   Whatever happened, set our new color internally as the
                 *   last color we sent to the OS.  Even if we didn't
                 *   actually do anything, we'll at least know we won't have
                 *   to do anything more until we find another new color. 
                 */
                os_color_ = *colors;
            }

            /* get this character */
            c = *txt;

            /* 
             *   translate non-breaking spaces into ordinary spaces if the
             *   underlying target isn't HTML-based 
             */
            if (!html_target_ && c == 0x00A0)
                c = ' ';

            /* try storing another character */
            old_rem = rem;
            cur = (cmap_ != 0 ? cmap_ : G_cmap_to_ui)->map(c, &dst, &rem);

            /* if that failed, flush the buffer and try again */
            if (cur > old_rem)
            {
                /* null-terminate the buffer */
                *dst = '\0';
                
                /* display the text */
                print_to_os(local_buf);

                /* reset to the start of the local output buffer */
                dst = local_buf;
                rem = sizeof(local_buf) - 1;
            }
            else
            {
                /* we've now consumed this character of input */
                ++txt;
                --cnt;
                if (colors != 0)
                    ++colors;
            }
        }

        /* if we have a partially-filled buffer, display it */
        if (dst > local_buf)
        {
            /* null-terminate and display the buffer */
            *dst = '\0';
            print_to_os(local_buf);
        }

        /* write the appropriate type of line termination */
        switch(nl)
        {
        case VM_NL_NONE:
        case VM_NL_INPUT:
        case VM_NL_NONE_INTERNAL:
            /* no line termination is needed */
            break;

        case VM_NL_NEWLINE:
            /* write a newline */
            print_to_os(html_target_ && html_pre_level_ == 0 ?
                        "<BR HEIGHT=0>\n" : "\n");
            break;

        case VM_NL_OSNEWLINE:
            /* 
             *   the OS will provide a newline, but add a space to make it
             *   explicit that we can break the line here 
             */
            print_to_os(" ");
            break;
        }
    }
}